

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UBool utf8TextAccess(UText *ut,int64_t index,UBool forward)

{
  void *pvVar1;
  int *piVar2;
  char cVar3;
  char cVar4;
  bool bVar5;
  undefined1 uVar6;
  byte bVar7;
  int iVar8;
  UChar32 UVar9;
  int *piVar10;
  int iVar11;
  bool bVar12;
  int local_d8;
  int32_t sIx;
  UChar32 c_1;
  int32_t bufNILimit;
  int32_t srcIx_1;
  int32_t destIx_1;
  int32_t toUCharsMapStart;
  uint8_t *mapToUChars_1;
  uint8_t *mapToNative_1;
  UChar *buf_1;
  UTF8Buf *u8b_swap_1;
  int iStack_98;
  uint8_t __t;
  int32_t dIxSaved;
  int32_t dIx;
  int32_t cIx;
  UChar32 c;
  int iStack_84;
  UBool seenNonAscii;
  int32_t srcIx;
  int32_t destIx;
  uint8_t *mapToUChars;
  uint8_t *mapToNative;
  UChar *buf;
  UBool nulTerminated;
  int32_t strLen;
  UTF8Buf *u8b_swap;
  UTF8Buf *altB_1;
  UTF8Buf *altB;
  int local_40;
  int32_t mapIndex;
  int32_t ix;
  int32_t length;
  UTF8Buf *u8b;
  uint8_t *s8;
  int64_t iStack_20;
  UBool forward_local;
  int64_t index_local;
  UText *ut_local;
  
  u8b = (UTF8Buf *)ut->context;
  mapIndex = ut->b;
  local_40 = (int)index;
  altB._4_4_ = 0;
  if (index < 0) {
    local_40 = 0;
  }
  else if (0x7fffffff < index) {
    local_40 = 0x7fffffff;
  }
  iVar11 = local_40;
  if (((mapIndex < local_40) && (iVar11 = mapIndex, mapIndex < 0)) &&
     (iVar11 = local_40, ut->c <= local_40)) {
    while( true ) {
      bVar12 = false;
      if (ut->c < local_40) {
        bVar12 = *(char *)((long)u8b->buf + (long)ut->c + -0x18) != '\0';
      }
      if (!bVar12) break;
      ut->c = ut->c + 1;
    }
    if (*(char *)((long)u8b->buf + (long)ut->c + -0x18) == '\0') {
      ut->b = ut->c;
      mapIndex = ut->c;
      ut->providerProperties = ut->providerProperties & 0xfffffffd;
      iVar11 = ut->c;
    }
  }
  local_40 = iVar11;
  s8._7_1_ = forward;
  iStack_20 = index;
  index_local = (int64_t)ut;
  if (forward == '\0') {
    if ((long)local_40 == ut->chunkNativeStart) {
      if (local_40 == 0) {
        ut->chunkOffset = 0;
        return '\0';
      }
      u8b_swap = (UTF8Buf *)ut->q;
      if ((u8b_swap->bufNativeStart < local_40) && (local_40 <= u8b_swap->bufNativeLimit))
      goto LAB_001c0393;
    }
    _ix = (int *)ut->q;
    if ((*_ix < local_40) && (local_40 <= _ix[1])) goto LAB_001c0393;
    if (local_40 != 0) {
      if ((ut->chunkNativeStart < (long)local_40) && ((long)local_40 <= ut->chunkNativeLimit)) {
        pvVar1 = ut->p;
        ut->chunkOffset =
             (uint)*(byte *)((long)pvVar1 + (long)(local_40 - *(int *)((long)pvVar1 + 0x14)) + 0x84)
             - *(int *)((long)pvVar1 + 8);
        if (ut->chunkOffset == 0) {
          return '\0';
        }
        return '\x01';
      }
      if ((local_40 != ut->b) && (*(char *)((long)u8b->buf + (long)local_40 + -0x18) < -0x40)) {
        local_40 = utf8_back1SafeBody_63((uint8_t *)u8b,0,local_40);
      }
      buf_1 = *(UChar **)(index_local + 0x58);
      *(undefined8 *)(index_local + 0x58) = *(undefined8 *)(index_local + 0x50);
      *(UChar **)(index_local + 0x50) = buf_1;
      mapToNative_1 = (uint8_t *)(buf_1 + 0xc);
      mapToUChars_1 = (uint8_t *)(buf_1 + 0x30);
      _destIx_1 = buf_1 + 0x42;
      srcIx_1 = local_40 + -0x65;
      bufNILimit = 0x22;
      c_1 = local_40;
      sIx = 0x22;
      *(char *)(buf_1 + 0x41) = (char)local_40 - (char)srcIx_1;
      *(undefined1 *)((long)_destIx_1 + (long)(local_40 - srcIx_1)) = 0x22;
      while( true ) {
        bVar12 = false;
        if ((2 < bufNILimit) && (bVar12 = false, 5 < c_1 - srcIx_1)) {
          bVar12 = 0 < c_1;
        }
        if (!bVar12) break;
        local_d8 = c_1 + -1;
        bufNILimit = bufNILimit + -1;
        bVar7 = *(byte *)((long)u8b->buf + (long)local_d8 + -0x18);
        c_1 = local_d8;
        if (bVar7 < 0x80) {
          *(ushort *)(mapToNative_1 + (long)bufNILimit * 2) = (ushort)bVar7;
          *(char *)((long)_destIx_1 + (long)(local_d8 - srcIx_1)) = (char)bufNILimit;
          mapToUChars_1[bufNILimit] = (char)local_d8 - (char)srcIx_1;
        }
        else {
          UVar9 = utf8_prevCharSafeBody_63((uint8_t *)u8b,0,&c_1,(uint)bVar7,-3);
          cVar4 = (char)c_1;
          cVar3 = (char)srcIx_1;
          if (UVar9 < 0x10000) {
            *(ushort *)(mapToNative_1 + (long)bufNILimit * 2) = (ushort)UVar9;
            mapToUChars_1[bufNILimit] = cVar4 - cVar3;
          }
          else {
            *(ushort *)(mapToNative_1 + (long)bufNILimit * 2) = (ushort)UVar9 & 0x3ff | 0xdc00;
            mapToUChars_1[bufNILimit] = cVar4 - cVar3;
            bufNILimit = bufNILimit + -1;
            *(short *)(mapToNative_1 + (long)bufNILimit * 2) = (short)(UVar9 >> 10) + -0x2840;
            mapToUChars_1[bufNILimit] = cVar4 - cVar3;
          }
          do {
            iVar11 = local_d8 + -1;
            *(char *)((long)_destIx_1 + (long)(local_d8 - srcIx_1)) = (char)bufNILimit;
            local_d8 = iVar11;
          } while (c_1 <= iVar11);
          sIx = bufNILimit;
        }
      }
      *(UChar32 *)buf_1 = c_1;
      *(int *)(buf_1 + 2) = local_40;
      *(int32_t *)(buf_1 + 4) = bufNILimit;
      buf_1[6] = L'\"';
      buf_1[7] = L'\0';
      *(int32_t *)(buf_1 + 8) = sIx - *(int *)(buf_1 + 4);
      *(int32_t *)(buf_1 + 10) = srcIx_1;
      *(uint8_t **)(index_local + 0x30) = mapToNative_1 + (long)*(int *)(buf_1 + 4) * 2;
      *(int *)(index_local + 0x2c) = *(int *)(buf_1 + 6) - *(int *)(buf_1 + 4);
      *(undefined4 *)(index_local + 0x28) = *(undefined4 *)(index_local + 0x2c);
      *(long *)(index_local + 0x20) = (long)*(int *)buf_1;
      *(long *)(index_local + 0x10) = (long)*(int *)(buf_1 + 2);
      *(undefined4 *)(index_local + 0x1c) = *(undefined4 *)(buf_1 + 8);
      return '\x01';
    }
    if (*_ix == 0) goto LAB_001c044f;
  }
  else {
    if ((long)local_40 == ut->chunkNativeLimit) {
      if (local_40 == mapIndex) {
        ut->chunkOffset = ut->chunkLength;
        return '\0';
      }
      altB_1 = (UTF8Buf *)ut->q;
      if ((altB_1->bufNativeStart <= local_40) && (local_40 < altB_1->bufNativeLimit))
      goto LAB_001c0393;
    }
    _ix = (int *)ut->q;
    if ((*_ix <= local_40) && (local_40 < _ix[1])) {
LAB_001c0393:
      piVar2 = (int *)ut->q;
      ut->q = ut->p;
      ut->p = piVar2;
      ut->chunkContents = (UChar *)((long)piVar2 + (long)piVar2[2] * 2 + 0x18);
      ut->chunkLength = piVar2[3] - piVar2[2];
      ut->chunkNativeStart = (long)*piVar2;
      ut->chunkNativeLimit = (long)piVar2[1];
      ut->nativeIndexingLimit = piVar2[4];
      ut->chunkOffset =
           (uint)*(byte *)((long)piVar2 + (long)(local_40 - piVar2[5]) + 0x84) - piVar2[2];
      return '\x01';
    }
    if (local_40 != mapIndex) {
      if ((ut->chunkNativeStart <= (long)local_40) && ((long)local_40 < ut->chunkNativeLimit)) {
        pvVar1 = ut->p;
        ut->chunkOffset =
             (uint)*(byte *)((long)pvVar1 + (long)(local_40 - *(int *)((long)pvVar1 + 0x14)) + 0x84)
             - *(int *)((long)pvVar1 + 8);
        return '\x01';
      }
      if (*(char *)((long)u8b->buf + (long)local_40 + -0x18) < -0x40) {
        local_40 = utf8_back1SafeBody_63((uint8_t *)u8b,0,local_40);
      }
      piVar2 = *(int **)(index_local + 0x58);
      *(undefined8 *)(index_local + 0x58) = *(undefined8 *)(index_local + 0x50);
      *(int **)(index_local + 0x50) = piVar2;
      buf._4_4_ = *(int *)(index_local + 0x78);
      bVar12 = buf._4_4_ < 0;
      if (bVar12) {
        buf._4_4_ = 0x7fffffff;
      }
      piVar10 = piVar2 + 6;
      iStack_84 = 0;
      c = local_40;
      bVar5 = false;
      dIx = 0;
      do {
        cVar4 = (char)local_40;
        if (0x1f < iStack_84) break;
        bVar7 = *(byte *)((long)u8b->buf + (long)c + -0x18);
        dIx = (int32_t)bVar7;
        cVar3 = (char)c;
        uVar6 = (undefined1)iStack_84;
        if ((dIx == 0) || (0x7f < (uint)dIx)) {
          if (!bVar5) {
            bVar5 = true;
            piVar2[4] = iStack_84;
          }
          dIxSaved = c;
          iStack_98 = iStack_84;
          iVar11 = c + 1;
          bVar7 = *(byte *)((long)u8b->buf + (long)c + -0x18);
          dIx = (int32_t)bVar7;
          if ((bVar7 & 0x80) != 0) {
            if (iVar11 != buf._4_4_) {
              if ((uint)dIx < 0xe0) {
                if (0xc1 < (uint)dIx) {
                  dIx = dIx & 0x1f;
                  c = iVar11;
LAB_001c088d:
                  bVar7 = *(char *)((long)u8b->buf + (long)c + -0x18) + 0x80;
                  iVar11 = c;
                  if (bVar7 < 0x40) {
                    dIx = dIx << 6 | (uint)bVar7;
                    iVar11 = c + 1;
                    goto LAB_001c08e3;
                  }
                }
              }
              else if ((uint)dIx < 0xf0) {
                dIx = dIx & 0xf;
                bVar7 = *(byte *)((long)u8b->buf + (long)iVar11 + -0x18);
                if (((int)" 000000000000\x1000"[dIx] & 1 << (sbyte)((int)(uint)bVar7 >> 5)) != 0) {
                  u8b_swap_1._3_1_ = bVar7 & 0x3f;
                  c = iVar11;
LAB_001c0842:
                  dIx = dIx << 6 | (uint)u8b_swap_1._3_1_;
                  iVar11 = c + 1;
                  c = iVar11;
                  if (iVar11 != buf._4_4_) goto LAB_001c088d;
                }
              }
              else {
                iVar8 = dIx - 0xf0;
                if ((iVar8 < 5) &&
                   (bVar7 = *(byte *)((long)u8b->buf + (long)iVar11 + -0x18),
                   ((int)""[(int)(uint)bVar7 >> 4] & 1 << ((byte)iVar8 & 0x1f)) != 0)) {
                  dIx = iVar8 * 0x40 | bVar7 & 0x3f;
                  c = c + 2;
                  iVar11 = c;
                  if ((c != buf._4_4_) &&
                     (u8b_swap_1._3_1_ = *(char *)((long)u8b->buf + (long)c + -0x18) + 0x80,
                     u8b_swap_1._3_1_ < 0x40)) goto LAB_001c0842;
                }
              }
            }
            c = iVar11;
            dIx = 0xfffd;
            iVar11 = c;
          }
LAB_001c08e3:
          c = iVar11;
          if ((dIx == 0) && (bVar12)) {
            c = c + -1;
            break;
          }
          if ((uint)dIx < 0x10000) {
            *(ushort *)((long)piVar10 + (long)iStack_84 * 2) = (ushort)dIx;
            iStack_84 = iStack_84 + 1;
          }
          else {
            iVar11 = iStack_84 + 1;
            *(short *)((long)piVar10 + (long)iStack_84 * 2) = (short)(dIx >> 10) + -0x2840;
            iStack_84 = iStack_84 + 2;
            *(ushort *)((long)piVar10 + (long)iVar11 * 2) = (ushort)dIx & 0x3ff | 0xdc00;
          }
          do {
            iVar11 = iStack_98 + 1;
            *(char *)((long)piVar2 + (long)iStack_98 + 0x60) = cVar3 - cVar4;
            iStack_98 = iVar11;
          } while (iVar11 < iStack_84);
          do {
            iVar11 = dIxSaved + 1;
            *(undefined1 *)((long)piVar2 + (long)(dIxSaved - local_40) + 0x84) = uVar6;
            dIxSaved = iVar11;
          } while (iVar11 < c);
        }
        else {
          *(ushort *)((long)piVar10 + (long)iStack_84 * 2) = (ushort)bVar7;
          *(char *)((long)piVar2 + (long)iStack_84 + 0x60) = cVar3 - cVar4;
          *(undefined1 *)((long)piVar2 + (long)(c - local_40) + 0x84) = uVar6;
          c = c + 1;
          iStack_84 = iStack_84 + 1;
        }
      } while (c < buf._4_4_);
      *(char *)((long)piVar2 + (long)iStack_84 + 0x60) = (char)c - cVar4;
      *(char *)((long)piVar2 + (long)(c - local_40) + 0x84) = (char)iStack_84;
      *piVar2 = local_40;
      piVar2[1] = c;
      piVar2[2] = 0;
      piVar2[3] = iStack_84;
      if (!bVar5) {
        piVar2[4] = iStack_84;
      }
      piVar2[5] = *piVar2;
      *(int **)(index_local + 0x30) = piVar10;
      *(undefined4 *)(index_local + 0x28) = 0;
      *(int *)(index_local + 0x2c) = piVar2[3];
      *(long *)(index_local + 0x20) = (long)*piVar2;
      *(long *)(index_local + 0x10) = (long)piVar2[1];
      *(int *)(index_local + 0x1c) = piVar2[4];
      if (((bVar12) && (*(int *)(index_local + 0x7c) < c)) &&
         (*(UChar32 *)(index_local + 0x7c) = c, dIx == 0)) {
        *(UChar32 *)(index_local + 0x78) = c;
        *(uint *)(index_local + 8) = *(uint *)(index_local + 8) & 0xfffffffd;
      }
      return '\x01';
    }
    if ((long)local_40 == ut->chunkNativeLimit) {
      ut->chunkOffset = ut->chunkLength;
      return '\0';
    }
    if (local_40 == _ix[1]) goto LAB_001c044f;
  }
  piVar2 = (int *)ut->q;
  *piVar2 = local_40;
  piVar2[1] = local_40;
  piVar2[2] = 0;
  piVar2[3] = 0;
  piVar2[4] = 0;
  piVar2[5] = local_40;
  *(undefined1 *)(piVar2 + 0x18) = 0;
  *(undefined1 *)(piVar2 + 0x21) = 0;
LAB_001c044f:
  piVar2 = (int *)ut->q;
  ut->q = ut->p;
  ut->p = piVar2;
  ut->chunkContents = (UChar *)((long)piVar2 + (long)piVar2[2] * 2 + 0x18);
  ut->chunkLength = piVar2[3] - piVar2[2];
  ut->chunkNativeStart = (long)*piVar2;
  ut->chunkNativeLimit = (long)piVar2[1];
  ut->nativeIndexingLimit = piVar2[4];
  if (local_40 == piVar2[1]) {
    ut->chunkOffset = ut->chunkLength;
  }
  else {
    ut->chunkOffset = 0;
  }
  return '\0';
}

Assistant:

static UBool U_CALLCONV
utf8TextAccess(UText *ut, int64_t index, UBool forward) {
    //
    //  Apologies to those who are allergic to goto statements.
    //    Consider each goto to a labelled block to be the equivalent of
    //         call the named block as if it were a function();
    //         return;
    //
    const uint8_t *s8=(const uint8_t *)ut->context;
    UTF8Buf *u8b = NULL;
    int32_t  length = ut->b;         // Length of original utf-8
    int32_t  ix= (int32_t)index;     // Requested index, trimmed to 32 bits.
    int32_t  mapIndex = 0;
    if (index<0) {
        ix=0;
    } else if (index > 0x7fffffff) {
        // Strings with 64 bit lengths not supported by this UTF-8 provider.
        ix = 0x7fffffff;
    }

    // Pin requested index to the string length.
    if (ix>length) {
        if (length>=0) {
            ix=length;
        } else if (ix>=ut->c) {
            // Zero terminated string, and requested index is beyond
            //   the region that has already been scanned.
            //   Scan up to either the end of the string or to the
            //   requested position, whichever comes first.
            while (ut->c<ix && s8[ut->c]!=0) {
                ut->c++;
            }
            //  TODO:  support for null terminated string length > 32 bits.
            if (s8[ut->c] == 0) {
                // We just found the actual length of the string.
                //  Trim the requested index back to that.
                ix     = ut->c;
                ut->b  = ut->c;
                length = ut->c;
                ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
            }
        }
    }

    //
    // Dispatch to the appropriate action for a forward iteration request.
    //
    if (forward) {
        if (ix==ut->chunkNativeLimit) {
            // Check for normal sequential iteration cases first.
            if (ix==length) {
                // Just reached end of string
                // Don't swap buffers, but do set the
                //   current buffer position.
                ut->chunkOffset = ut->chunkLength;
                return FALSE;
            } else {
                // End of current buffer.
                //   check whether other buffer already has what we need.
                UTF8Buf *altB = (UTF8Buf *)ut->q;
                if (ix>=altB->bufNativeStart && ix<altB->bufNativeLimit) {
                    goto swapBuffers;
                }
            }
        }

        // A random access.  Desired index could be in either or niether buf.
        // For optimizing the order of testing, first check for the index
        //    being in the other buffer.  This will be the case for uses that
        //    move back and forth over a fairly limited range
        {
            u8b = (UTF8Buf *)ut->q;   // the alternate buffer
            if (ix>=u8b->bufNativeStart && ix<u8b->bufNativeLimit) {
                // Requested index is in the other buffer.
                goto swapBuffers;
            }
            if (ix == length) {
                // Requested index is end-of-string.
                //   (this is the case of randomly seeking to the end.
                //    The case of iterating off the end is handled earlier.)
                if (ix == ut->chunkNativeLimit) {
                    // Current buffer extends up to the end of the string.
                    //   Leave it as the current buffer.
                    ut->chunkOffset = ut->chunkLength;
                    return FALSE;
                }
                if (ix == u8b->bufNativeLimit) {
                    // Alternate buffer extends to the end of string.
                    //   Swap it in as the current buffer.
                    goto swapBuffersAndFail;
                }

                // Neither existing buffer extends to the end of the string.
                goto makeStubBuffer;
            }

            if (ix<ut->chunkNativeStart || ix>=ut->chunkNativeLimit) {
                // Requested index is in neither buffer.
                goto fillForward;
            }

            // Requested index is in this buffer.
            u8b = (UTF8Buf *)ut->p;   // the current buffer
            mapIndex = ix - u8b->toUCharsMapStart;
            U_ASSERT(mapIndex < (int32_t)sizeof(UTF8Buf::mapToUChars));
            ut->chunkOffset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;
            return TRUE;

        }
    }


    //
    // Dispatch to the appropriate action for a
    //   Backwards Diretion iteration request.
    //
    if (ix==ut->chunkNativeStart) {
        // Check for normal sequential iteration cases first.
        if (ix==0) {
            // Just reached the start of string
            // Don't swap buffers, but do set the
            //   current buffer position.
            ut->chunkOffset = 0;
            return FALSE;
        } else {
            // Start of current buffer.
            //   check whether other buffer already has what we need.
            UTF8Buf *altB = (UTF8Buf *)ut->q;
            if (ix>altB->bufNativeStart && ix<=altB->bufNativeLimit) {
                goto swapBuffers;
            }
        }
    }

    // A random access.  Desired index could be in either or niether buf.
    // For optimizing the order of testing,
    //    Most likely case:  in the other buffer.
    //    Second most likely: in neither buffer.
    //    Unlikely, but must work:  in the current buffer.
    u8b = (UTF8Buf *)ut->q;   // the alternate buffer
    if (ix>u8b->bufNativeStart && ix<=u8b->bufNativeLimit) {
        // Requested index is in the other buffer.
        goto swapBuffers;
    }
    // Requested index is start-of-string.
    //   (this is the case of randomly seeking to the start.
    //    The case of iterating off the start is handled earlier.)
    if (ix==0) {
        if (u8b->bufNativeStart==0) {
            // Alternate buffer contains the data for the start string.
            // Make it be the current buffer.
            goto swapBuffersAndFail;
        } else {
            // Request for data before the start of string,
            //   neither buffer is usable.
            //   set up a zero-length buffer.
            goto makeStubBuffer;
        }
    }

    if (ix<=ut->chunkNativeStart || ix>ut->chunkNativeLimit) {
        // Requested index is in neither buffer.
        goto fillReverse;
    }

    // Requested index is in this buffer.
    //   Set the utf16 buffer index.
    u8b = (UTF8Buf *)ut->p;
    mapIndex = ix - u8b->toUCharsMapStart;
    ut->chunkOffset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;
    if (ut->chunkOffset==0) {
        // This occurs when the first character in the text is
        //   a multi-byte UTF-8 char, and the requested index is to
        //   one of the trailing bytes.  Because there is no preceding ,
        //   character, this access fails.  We can't pick up on the
        //   situation sooner because the requested index is not zero.
        return FALSE;
    } else {
        return TRUE;
    }



swapBuffers:
    //  The alternate buffer (ut->q) has the string data that was requested.
    //  Swap the primary and alternate buffers, and set the
    //   chunk index into the new primary buffer.
    {
        u8b   = (UTF8Buf *)ut->q;
        ut->q = ut->p;
        ut->p = u8b;
        ut->chunkContents       = &u8b->buf[u8b->bufStartIdx];
        ut->chunkLength         = u8b->bufLimitIdx - u8b->bufStartIdx;
        ut->chunkNativeStart    = u8b->bufNativeStart;
        ut->chunkNativeLimit    = u8b->bufNativeLimit;
        ut->nativeIndexingLimit = u8b->bufNILimit;

        // Index into the (now current) chunk
        // Use the map to set the chunk index.  It's more trouble than it's worth
        //    to check whether native indexing can be used.
        U_ASSERT(ix>=u8b->bufNativeStart);
        U_ASSERT(ix<=u8b->bufNativeLimit);
        mapIndex = ix - u8b->toUCharsMapStart;
        U_ASSERT(mapIndex>=0);
        U_ASSERT(mapIndex<(int32_t)sizeof(u8b->mapToUChars));
        ut->chunkOffset = u8b->mapToUChars[mapIndex] - u8b->bufStartIdx;

        return TRUE;
    }


 swapBuffersAndFail:
    // We got a request for either the start or end of the string,
    //  with iteration continuing in the out-of-bounds direction.
    // The alternate buffer already contains the data up to the
    //  start/end.
    // Swap the buffers, then return failure, indicating that we couldn't
    //  make things correct for continuing the iteration in the requested
    //  direction.  The position & buffer are correct should the
    //  user decide to iterate in the opposite direction.
    u8b   = (UTF8Buf *)ut->q;
    ut->q = ut->p;
    ut->p = u8b;
    ut->chunkContents       = &u8b->buf[u8b->bufStartIdx];
    ut->chunkLength         = u8b->bufLimitIdx - u8b->bufStartIdx;
    ut->chunkNativeStart    = u8b->bufNativeStart;
    ut->chunkNativeLimit    = u8b->bufNativeLimit;
    ut->nativeIndexingLimit = u8b->bufNILimit;

    // Index into the (now current) chunk
    //  For this function  (swapBuffersAndFail), the requested index
    //    will always be at either the start or end of the chunk.
    if (ix==u8b->bufNativeLimit) {
        ut->chunkOffset = ut->chunkLength;
    } else  {
        ut->chunkOffset = 0;
        U_ASSERT(ix == u8b->bufNativeStart);
    }
    return FALSE;

makeStubBuffer:
    //   The user has done a seek/access past the start or end
    //   of the string.  Rather than loading data that is likely
    //   to never be used, just set up a zero-length buffer at
    //   the position.
    u8b = (UTF8Buf *)ut->q;
    u8b->bufNativeStart   = ix;
    u8b->bufNativeLimit   = ix;
    u8b->bufStartIdx      = 0;
    u8b->bufLimitIdx      = 0;
    u8b->bufNILimit       = 0;
    u8b->toUCharsMapStart = ix;
    u8b->mapToNative[0]   = 0;
    u8b->mapToUChars[0]   = 0;
    goto swapBuffersAndFail;



fillForward:
    {
        // Move the incoming index to a code point boundary.
        U8_SET_CP_START(s8, 0, ix);

        // Swap the UText buffers.
        //  We want to fill what was previously the alternate buffer,
        //  and make what was the current buffer be the new alternate.
        UTF8Buf *u8b_swap = (UTF8Buf *)ut->q;
        ut->q = ut->p;
        ut->p = u8b_swap;

        int32_t strLen = ut->b;
        UBool   nulTerminated = FALSE;
        if (strLen < 0) {
            strLen = 0x7fffffff;
            nulTerminated = TRUE;
        }

        UChar   *buf = u8b_swap->buf;
        uint8_t *mapToNative  = u8b_swap->mapToNative;
        uint8_t *mapToUChars  = u8b_swap->mapToUChars;
        int32_t  destIx       = 0;
        int32_t  srcIx        = ix;
        UBool    seenNonAscii = FALSE;
        UChar32  c = 0;

        // Fill the chunk buffer and mapping arrays.
        while (destIx<UTF8_TEXT_CHUNK_SIZE) {
            c = s8[srcIx];
            if (c>0 && c<0x80) {
                // Special case ASCII range for speed.
                //   zero is excluded to simplify bounds checking.
                buf[destIx] = (UChar)c;
                mapToNative[destIx]    = (uint8_t)(srcIx - ix);
                mapToUChars[srcIx-ix]  = (uint8_t)destIx;
                srcIx++;
                destIx++;
            } else {
                // General case, handle everything.
                if (seenNonAscii == FALSE) {
                    seenNonAscii = TRUE;
                    u8b_swap->bufNILimit = destIx;
                }

                int32_t  cIx      = srcIx;
                int32_t  dIx      = destIx;
                int32_t  dIxSaved = destIx;
                U8_NEXT_OR_FFFD(s8, srcIx, strLen, c);
                if (c==0 && nulTerminated) {
                    srcIx--;
                    break;
                }

                U16_APPEND_UNSAFE(buf, destIx, c);
                do {
                    mapToNative[dIx++] = (uint8_t)(cIx - ix);
                } while (dIx < destIx);

                do {
                    mapToUChars[cIx++ - ix] = (uint8_t)dIxSaved;
                } while (cIx < srcIx);
            }
            if (srcIx>=strLen) {
                break;
            }

        }

        //  store Native <--> Chunk Map entries for the end of the buffer.
        //    There is no actual character here, but the index position is valid.
        mapToNative[destIx]     = (uint8_t)(srcIx - ix);
        mapToUChars[srcIx - ix] = (uint8_t)destIx;

        //  fill in Buffer descriptor
        u8b_swap->bufNativeStart     = ix;
        u8b_swap->bufNativeLimit     = srcIx;
        u8b_swap->bufStartIdx        = 0;
        u8b_swap->bufLimitIdx        = destIx;
        if (seenNonAscii == FALSE) {
            u8b_swap->bufNILimit     = destIx;
        }
        u8b_swap->toUCharsMapStart   = u8b_swap->bufNativeStart;

        // Set UText chunk to refer to this buffer.
        ut->chunkContents       = buf;
        ut->chunkOffset         = 0;
        ut->chunkLength         = u8b_swap->bufLimitIdx;
        ut->chunkNativeStart    = u8b_swap->bufNativeStart;
        ut->chunkNativeLimit    = u8b_swap->bufNativeLimit;
        ut->nativeIndexingLimit = u8b_swap->bufNILimit;

        // For zero terminated strings, keep track of the maximum point
        //   scanned so far.
        if (nulTerminated && srcIx>ut->c) {
            ut->c = srcIx;
            if (c==0) {
                // We scanned to the end.
                //   Remember the actual length.
                ut->b = srcIx;
                ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
            }
        }
        return TRUE;
    }


fillReverse:
    {
        // Move the incoming index to a code point boundary.
        // Can only do this if the incoming index is somewhere in the interior of the string.
        //   If index is at the end, there is no character there to look at.
        if (ix != ut->b) {
            // Note: this function will only move the index back if it is on a trail byte
            //       and there is a preceding lead byte and the sequence from the lead 
            //       through this trail could be part of a valid UTF-8 sequence
            //       Otherwise the index remains unchanged.
            U8_SET_CP_START(s8, 0, ix);
        }

        // Swap the UText buffers.
        //  We want to fill what was previously the alternate buffer,
        //  and make what was the current buffer be the new alternate.
        UTF8Buf *u8b_swap = (UTF8Buf *)ut->q;
        ut->q = ut->p;
        ut->p = u8b_swap;

        UChar   *buf = u8b_swap->buf;
        uint8_t *mapToNative = u8b_swap->mapToNative;
        uint8_t *mapToUChars = u8b_swap->mapToUChars;
        int32_t  toUCharsMapStart = ix - sizeof(UTF8Buf::mapToUChars) + 1;
        // Note that toUCharsMapStart can be negative. Happens when the remaining
        // text from current position to the beginning is less than the buffer size.
        // + 1 because mapToUChars must have a slot at the end for the bufNativeLimit entry.
        int32_t  destIx = UTF8_TEXT_CHUNK_SIZE+2;   // Start in the overflow region
                                                    //   at end of buffer to leave room
                                                    //   for a surrogate pair at the
                                                    //   buffer start.
        int32_t  srcIx  = ix;
        int32_t  bufNILimit = destIx;
        UChar32   c;

        // Map to/from Native Indexes, fill in for the position at the end of
        //   the buffer.
        //
        mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
        mapToUChars[srcIx - toUCharsMapStart] = (uint8_t)destIx;

        // Fill the chunk buffer
        // Work backwards, filling from the end of the buffer towards the front.
        //
        while (destIx>2 && (srcIx - toUCharsMapStart > 5) && (srcIx > 0)) {
            srcIx--;
            destIx--;

            // Get last byte of the UTF-8 character
            c = s8[srcIx];
            if (c<0x80) {
                // Special case ASCII range for speed.
                buf[destIx] = (UChar)c;
                U_ASSERT(toUCharsMapStart <= srcIx);
                mapToUChars[srcIx - toUCharsMapStart] = (uint8_t)destIx;
                mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
            } else {
                // General case, handle everything non-ASCII.

                int32_t  sIx      = srcIx;  // ix of last byte of multi-byte u8 char

                // Get the full character from the UTF8 string.
                //   use code derived from tbe macros in utf8.h
                //   Leaves srcIx pointing at the first byte of the UTF-8 char.
                //
                c=utf8_prevCharSafeBody(s8, 0, &srcIx, c, -3);
                // leaves srcIx at first byte of the multi-byte char.

                // Store the character in UTF-16 buffer.
                if (c<0x10000) {
                    buf[destIx] = (UChar)c;
                    mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
                } else {
                    buf[destIx]         = U16_TRAIL(c);
                    mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
                    buf[--destIx]       = U16_LEAD(c);
                    mapToNative[destIx] = (uint8_t)(srcIx - toUCharsMapStart);
                }

                // Fill in the map from native indexes to UChars buf index.
                do {
                    mapToUChars[sIx-- - toUCharsMapStart] = (uint8_t)destIx;
                } while (sIx >= srcIx);
                U_ASSERT(toUCharsMapStart <= (srcIx+1));

                // Set native indexing limit to be the current position.
                //   We are processing a non-ascii, non-native-indexing char now;
                //     the limit will be here if the rest of the chars to be
                //     added to this buffer are ascii.
                bufNILimit = destIx;
            }
        }
        u8b_swap->bufNativeStart     = srcIx;
        u8b_swap->bufNativeLimit     = ix;
        u8b_swap->bufStartIdx        = destIx;
        u8b_swap->bufLimitIdx        = UTF8_TEXT_CHUNK_SIZE+2;
        u8b_swap->bufNILimit         = bufNILimit - u8b_swap->bufStartIdx;
        u8b_swap->toUCharsMapStart   = toUCharsMapStart;

        ut->chunkContents       = &buf[u8b_swap->bufStartIdx];
        ut->chunkLength         = u8b_swap->bufLimitIdx - u8b_swap->bufStartIdx;
        ut->chunkOffset         = ut->chunkLength;
        ut->chunkNativeStart    = u8b_swap->bufNativeStart;
        ut->chunkNativeLimit    = u8b_swap->bufNativeLimit;
        ut->nativeIndexingLimit = u8b_swap->bufNILimit;
        return TRUE;
    }

}